

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_rounding_unroll_2_24_True_winner_unconditional
               (integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int i;
  int iVar16;
  int row;
  int row_00;
  int iVar17;
  float *pfVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  float *pfVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 auVar69 [64];
  float fVar70;
  undefined1 auVar71 [64];
  float fVar72;
  undefined1 in_ZMM7 [64];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 in_ZMM10 [64];
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM14 [64];
  float fVar73;
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  
  fVar68 = ipoint->scale;
  auVar43._8_4_ = 0x3effffff;
  auVar43._0_8_ = 0x3effffff3effffff;
  auVar43._12_4_ = 0x3effffff;
  auVar44._8_4_ = 0x80000000;
  auVar44._0_8_ = 0x8000000080000000;
  auVar44._12_4_ = 0x80000000;
  auVar67 = ZEXT416((uint)fVar68);
  auVar35 = vpternlogd_avx512vl(auVar43,auVar67,auVar44,0xf8);
  auVar36 = vpternlogd_avx512vl(auVar43,ZEXT416((uint)ipoint->y),auVar44,0xf8);
  auVar35 = ZEXT416((uint)(fVar68 + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36 = ZEXT416((uint)(ipoint->y + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  iVar16 = (int)auVar35._0_4_;
  auVar37 = vpternlogd_avx512vl(auVar43,ZEXT416((uint)ipoint->x),auVar44,0xf8);
  auVar38._0_8_ = (double)auVar36._0_4_;
  auVar38._8_8_ = auVar36._8_8_;
  auVar42._0_8_ = (double)fVar68;
  auVar42._8_8_ = 0;
  auVar36 = ZEXT416((uint)(ipoint->x + auVar37._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37._0_8_ = (double)auVar36._0_4_;
  auVar37._8_8_ = auVar36._8_8_;
  auVar36 = vfmadd231sd_fma(auVar38,auVar42,ZEXT816(0x3fe0000000000000));
  auVar37 = vfmadd231sd_fma(auVar37,auVar42,ZEXT816(0x3fe0000000000000));
  auVar41._0_4_ = (int)auVar35._0_4_;
  auVar41._4_4_ = (int)auVar35._4_4_;
  auVar41._8_4_ = (int)auVar35._8_4_;
  auVar41._12_4_ = (int)auVar35._12_4_;
  auVar35 = vcvtdq2ps_avx(auVar41);
  fVar4 = (float)auVar37._0_8_ - auVar35._0_4_;
  lVar32 = 0x60;
  for (uVar19 = 0xfffffff4; (int)uVar19 < 0xc; uVar19 = uVar19 + 2) {
    auVar45._0_4_ = (float)(int)uVar19;
    auVar45._4_12_ = in_ZMM7._4_12_;
    auVar49._8_4_ = 0x3effffff;
    auVar49._0_8_ = 0x3effffff3effffff;
    auVar49._12_4_ = 0x3effffff;
    auVar50._8_4_ = 0x80000000;
    auVar50._0_8_ = 0x8000000080000000;
    auVar50._12_4_ = 0x80000000;
    auVar41 = ZEXT416((uint)((float)auVar36._0_8_ - auVar35._0_4_));
    auVar37 = vfmadd213ss_fma(auVar45,auVar67,auVar41);
    auVar46._0_4_ = (float)(int)(uVar19 | 1);
    auVar46._4_12_ = in_ZMM7._4_12_;
    auVar41 = vfmadd213ss_fma(auVar46,auVar67,auVar41);
    auVar38 = vpternlogd_avx512vl(auVar49,auVar37,auVar50,0xf8);
    auVar37 = ZEXT416((uint)(auVar37._0_4_ + auVar38._0_4_));
    auVar37 = vroundss_avx(auVar37,auVar37,0xb);
    row = (int)auVar37._0_4_;
    auVar37 = vpternlogd_avx512vl(auVar49,auVar41,auVar50,0xf8);
    auVar37 = ZEXT416((uint)(auVar41._0_4_ + auVar37._0_4_));
    auVar37 = vroundss_avx(auVar37,auVar37,0xb);
    row_00 = (int)auVar37._0_4_;
    lVar31 = lVar32;
    for (iVar17 = -0xc; iVar17 < 0xc; iVar17 = iVar17 + 0x18) {
      auVar51._0_4_ = (float)iVar17;
      auVar58._4_12_ = in_ZMM7._4_12_;
      auVar51._4_12_ = auVar58._4_12_;
      auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x3effffff));
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
      auVar64._0_4_ = (float)(iVar17 + 1);
      auVar64._4_12_ = auVar58._4_12_;
      auVar41 = vfmadd213ss_avx512f(auVar51,auVar67,ZEXT416((uint)fVar4));
      auVar38 = vfmadd213ss_avx512f(auVar64,auVar67,ZEXT416((uint)fVar4));
      auVar52._0_4_ = (float)(iVar17 + 2);
      auVar52._4_12_ = auVar58._4_12_;
      auVar37 = ZEXT416((uint)fVar4);
      auVar42 = vfmadd213ss_avx512f(auVar52,auVar67,auVar37);
      auVar53._0_4_ = (float)(iVar17 + 3);
      auVar53._4_12_ = auVar58._4_12_;
      auVar43 = vfmadd213ss_avx512f(auVar53,auVar67,auVar37);
      auVar54._0_4_ = (float)(iVar17 + 4);
      auVar54._4_12_ = auVar58._4_12_;
      auVar44 = vfmadd213ss_avx512f(auVar54,auVar67,auVar37);
      auVar55._0_4_ = (float)(iVar17 + 5);
      auVar55._4_12_ = auVar58._4_12_;
      auVar45 = vfmadd213ss_avx512f(auVar55,auVar67,auVar37);
      auVar56._0_4_ = (float)(iVar17 + 6);
      auVar56._4_12_ = auVar58._4_12_;
      auVar37 = ZEXT416((uint)fVar4);
      auVar46 = vfmadd213ss_avx512f(auVar56,auVar67,auVar37);
      auVar57._0_4_ = (float)(iVar17 + 7);
      auVar57._4_12_ = auVar58._4_12_;
      auVar47 = vfmadd213ss_avx512f(auVar57,auVar67,auVar37);
      auVar58._0_4_ = (float)(iVar17 + 8);
      auVar48 = vfmadd213ss_avx512f(auVar58,auVar67,auVar37);
      auVar59._0_4_ = (float)(iVar17 + 9);
      auVar59._4_12_ = in_ZMM8._4_12_;
      auVar49 = vfmadd213ss_avx512f(auVar59,auVar67,auVar37);
      auVar60._0_4_ = (float)(iVar17 + 10);
      auVar60._4_12_ = in_ZMM9._4_12_;
      auVar50 = vfmadd213ss_avx512f(auVar60,auVar67,auVar37);
      auVar61._0_4_ = (float)(iVar17 + 0xb);
      auVar61._4_12_ = in_ZMM10._4_12_;
      auVar51 = vfmadd213ss_avx512f(auVar61,auVar67,auVar37);
      auVar62._0_4_ = (float)(iVar17 + 0xc);
      auVar62._4_12_ = in_ZMM11._4_12_;
      auVar52 = vfmadd213ss_avx512f(auVar62,auVar67,auVar37);
      in_ZMM11 = ZEXT1664(auVar52);
      auVar63._0_4_ = (float)(iVar17 + 0xd);
      auVar63._4_12_ = in_ZMM12._4_12_;
      auVar53 = vfmadd213ss_avx512f(auVar63,auVar67,auVar37);
      in_ZMM12 = ZEXT1664(auVar53);
      auVar65._0_4_ = (float)(iVar17 + 0xe);
      auVar65._4_12_ = in_ZMM14._4_12_;
      auVar63 = ZEXT416((uint)fVar4);
      auVar54 = vfmadd213ss_avx512f(auVar65,auVar67,auVar63);
      in_ZMM14 = ZEXT1664(auVar54);
      auVar66._0_4_ = (float)(iVar17 + 0xf);
      auVar66._4_12_ = in_ZMM15._4_12_;
      auVar55 = vfmadd213ss_avx512f(auVar66,auVar67,auVar63);
      in_ZMM15 = ZEXT1664(auVar55);
      auVar37 = vcvtsi2ss_avx512f(in_ZMM16._0_16_,iVar17 + 0x10);
      auVar56 = vfmadd213ss_avx512f(auVar37,auVar67,auVar63);
      in_ZMM16 = ZEXT1664(auVar56);
      auVar37 = vcvtsi2ss_avx512f(in_ZMM17._0_16_,iVar17 + 0x11);
      auVar57 = vfmadd213ss_avx512f(auVar37,auVar67,auVar63);
      in_ZMM17 = ZEXT1664(auVar57);
      auVar37 = vcvtsi2ss_avx512f(in_ZMM18._0_16_,iVar17 + 0x12);
      auVar58 = vfmadd213ss_avx512f(auVar37,auVar67,auVar63);
      in_ZMM18 = ZEXT1664(auVar58);
      auVar37 = vcvtsi2ss_avx512f(in_ZMM19._0_16_,iVar17 + 0x13);
      auVar59 = vfmadd213ss_avx512f(auVar37,auVar67,auVar63);
      in_ZMM19 = ZEXT1664(auVar59);
      auVar37 = vcvtsi2ss_avx512f(in_ZMM20._0_16_,iVar17 + 0x14);
      auVar60 = vfmadd213ss_avx512f(auVar37,auVar67,auVar63);
      in_ZMM20 = ZEXT1664(auVar60);
      auVar37 = vcvtsi2ss_avx512f(in_ZMM21._0_16_,iVar17 + 0x15);
      auVar61 = vfmadd213ss_avx512f(auVar37,auVar67,auVar63);
      in_ZMM21 = ZEXT1664(auVar61);
      auVar37 = vcvtsi2ss_avx512f(in_ZMM22._0_16_,iVar17 + 0x16);
      auVar62 = vfmadd213ss_avx512f(auVar37,auVar67,auVar63);
      in_ZMM22 = ZEXT1664(auVar62);
      auVar37 = vcvtsi2ss_avx512f(in_ZMM23._0_16_,iVar17 + 0x17);
      auVar63 = vfmadd213ss_avx512f(auVar37,auVar67,auVar63);
      in_ZMM23 = ZEXT1664(auVar63);
      auVar37 = vmovdqa64_avx512vl(auVar39);
      auVar37 = vpternlogd_avx512vl(auVar37,auVar38,auVar40,0xf8);
      auVar37 = vaddss_avx512f(auVar38,auVar37);
      auVar37 = vroundss_avx(auVar37,auVar37,0xb);
      auVar38 = vmovdqa64_avx512vl(auVar39);
      auVar38 = vpternlogd_avx512vl(auVar38,auVar41,auVar40,0xf8);
      auVar41 = ZEXT416((uint)(auVar38._0_4_ + auVar41._0_4_));
      auVar41 = vroundss_avx(auVar41,auVar41,0xb);
      auVar38 = vmovdqa64_avx512vl(auVar39);
      auVar38 = vpternlogd_avx512vl(auVar38,auVar42,auVar40,0xf8);
      auVar64 = vmovdqa64_avx512vl(auVar39);
      auVar64 = vpternlogd_avx512vl(auVar64,auVar54,auVar40,0xf8);
      auVar38 = ZEXT416((uint)(auVar42._0_4_ + auVar38._0_4_));
      auVar38 = vroundss_avx(auVar38,auVar38,0xb);
      auVar42 = vmovdqa64_avx512vl(auVar39);
      auVar42 = vpternlogd_avx512vl(auVar42,auVar43,auVar40,0xf8);
      auVar65 = vmovdqa64_avx512vl(auVar39);
      auVar65 = vpternlogd_avx512vl(auVar65,auVar55,auVar40,0xf8);
      auVar42 = ZEXT416((uint)(auVar43._0_4_ + auVar42._0_4_));
      auVar42 = vroundss_avx(auVar42,auVar42,0xb);
      auVar43 = vmovdqa64_avx512vl(auVar39);
      auVar43 = vpternlogd_avx512vl(auVar43,auVar44,auVar40,0xf8);
      auVar66 = vmovdqa64_avx512vl(auVar39);
      auVar66 = vpternlogd_avx512vl(auVar66,auVar56,auVar40,0xf8);
      auVar56 = vaddss_avx512f(auVar56,auVar66);
      auVar43 = ZEXT416((uint)(auVar44._0_4_ + auVar43._0_4_));
      auVar43 = vroundss_avx(auVar43,auVar43,0xb);
      auVar44 = vmovdqa64_avx512vl(auVar39);
      auVar44 = vpternlogd_avx512vl(auVar44,auVar45,auVar40,0xf8);
      auVar66 = vmovdqa64_avx512vl(auVar39);
      auVar66 = vpternlogd_avx512vl(auVar66,auVar57,auVar40,0xf8);
      auVar57 = vaddss_avx512f(auVar57,auVar66);
      auVar44 = ZEXT416((uint)(auVar45._0_4_ + auVar44._0_4_));
      auVar44 = vroundss_avx(auVar44,auVar44,0xb);
      auVar45 = vmovdqa64_avx512vl(auVar39);
      auVar45 = vpternlogd_avx512vl(auVar45,auVar46,auVar40,0xf8);
      auVar66 = vmovdqa64_avx512vl(auVar39);
      auVar66 = vpternlogd_avx512vl(auVar66,auVar58,auVar40,0xf8);
      auVar58 = vaddss_avx512f(auVar58,auVar66);
      auVar45 = ZEXT416((uint)(auVar46._0_4_ + auVar45._0_4_));
      auVar45 = vroundss_avx(auVar45,auVar45,0xb);
      auVar46 = vmovdqa64_avx512vl(auVar39);
      auVar46 = vpternlogd_avx512vl(auVar46,auVar47,auVar40,0xf8);
      auVar66 = vmovdqa64_avx512vl(auVar39);
      auVar66 = vpternlogd_avx512vl(auVar66,auVar59,auVar40,0xf8);
      auVar59 = vaddss_avx512f(auVar59,auVar66);
      auVar46 = ZEXT416((uint)(auVar47._0_4_ + auVar46._0_4_));
      auVar46 = vroundss_avx(auVar46,auVar46,0xb);
      auVar47 = vmovdqa64_avx512vl(auVar39);
      auVar47 = vpternlogd_avx512vl(auVar47,auVar48,auVar40,0xf8);
      auVar66 = vmovdqa64_avx512vl(auVar39);
      auVar66 = vpternlogd_avx512vl(auVar66,auVar60,auVar40,0xf8);
      auVar60 = vaddss_avx512f(auVar60,auVar66);
      auVar47 = ZEXT416((uint)(auVar48._0_4_ + auVar47._0_4_));
      auVar47 = vroundss_avx(auVar47,auVar47,0xb);
      auVar48 = vmovdqa64_avx512vl(auVar39);
      auVar48 = vpternlogd_avx512vl(auVar48,auVar49,auVar40,0xf8);
      auVar66 = vmovdqa64_avx512vl(auVar39);
      auVar66 = vpternlogd_avx512vl(auVar66,auVar61,auVar40,0xf8);
      auVar61 = vaddss_avx512f(auVar61,auVar66);
      auVar48 = ZEXT416((uint)(auVar49._0_4_ + auVar48._0_4_));
      auVar48 = vroundss_avx(auVar48,auVar48,0xb);
      auVar49 = vmovdqa64_avx512vl(auVar39);
      auVar49 = vpternlogd_avx512vl(auVar49,auVar50,auVar40,0xf8);
      auVar66 = vmovdqa64_avx512vl(auVar39);
      auVar66 = vpternlogd_avx512vl(auVar66,auVar62,auVar40,0xf8);
      auVar62 = vaddss_avx512f(auVar62,auVar66);
      auVar49 = ZEXT416((uint)(auVar50._0_4_ + auVar49._0_4_));
      auVar49 = vroundss_avx(auVar49,auVar49,0xb);
      auVar50 = vmovdqa64_avx512vl(auVar39);
      auVar50 = vpternlogd_avx512vl(auVar50,auVar51,auVar40,0xf8);
      auVar66 = vmovdqa64_avx512vl(auVar39);
      auVar66 = vpternlogd_avx512vl(auVar66,auVar63,auVar40,0xf8);
      auVar63 = vaddss_avx512f(auVar63,auVar66);
      auVar50 = ZEXT416((uint)(auVar51._0_4_ + auVar50._0_4_));
      auVar50 = vroundss_avx(auVar50,auVar50,0xb);
      auVar51 = vmovdqa64_avx512vl(auVar39);
      auVar51 = vpternlogd_avx512vl(auVar51,auVar52,auVar40,0xf8);
      auVar51 = ZEXT416((uint)(auVar52._0_4_ + auVar51._0_4_));
      auVar51 = vroundss_avx(auVar51,auVar51,0xb);
      auVar39 = vmovdqa64_avx512vl(auVar39);
      auVar39 = vpternlogd_avx512vl(auVar39,auVar53,auVar40,0xf8);
      auVar39 = ZEXT416((uint)(auVar53._0_4_ + auVar39._0_4_));
      auVar39 = vroundss_avx(auVar39,auVar39,0xb);
      auVar40 = ZEXT416((uint)(auVar54._0_4_ + auVar64._0_4_));
      auVar40 = vroundss_avx(auVar40,auVar40,0xb);
      auVar52 = ZEXT416((uint)(auVar55._0_4_ + auVar65._0_4_));
      auVar52 = vroundss_avx(auVar52,auVar52,0xb);
      auVar53 = vroundss_avx(auVar56,auVar56,0xb);
      auVar54 = vroundss_avx(auVar57,auVar57,0xb);
      auVar55 = vroundss_avx(auVar58,auVar58,0xb);
      auVar56 = vroundss_avx(auVar59,auVar59,0xb);
      auVar57 = vroundss_avx(auVar60,auVar60,0xb);
      in_ZMM7 = ZEXT1664(auVar57);
      auVar58 = vroundss_avx(auVar61,auVar61,0xb);
      in_ZMM8 = ZEXT1664(auVar58);
      auVar59 = vroundss_avx(auVar62,auVar62,0xb);
      in_ZMM9 = ZEXT1664(auVar59);
      auVar60 = vroundss_avx(auVar63,auVar63,0xb);
      in_ZMM10 = ZEXT1664(auVar60);
      haarXY_unconditional
                (iimage,row,(int)auVar41._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x60),
                 (float *)((long)haarResponseY + lVar31 + -0x60));
      haarXY_unconditional
                (iimage,row_00,(int)auVar41._0_4_,iVar16,(float *)((long)haarResponseX + lVar31),
                 (float *)((long)haarResponseY + lVar31));
      haarXY_unconditional
                (iimage,row,(int)auVar37._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x5c),
                 (float *)((long)haarResponseY + lVar31 + -0x5c));
      haarXY_unconditional
                (iimage,row_00,(int)auVar37._0_4_,iVar16,(float *)((long)haarResponseX + lVar31 + 4)
                 ,(float *)((long)haarResponseY + lVar31 + 4));
      haarXY_unconditional
                (iimage,row,(int)auVar38._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x58),
                 (float *)((long)haarResponseY + lVar31 + -0x58));
      haarXY_unconditional
                (iimage,row_00,(int)auVar38._0_4_,iVar16,(float *)((long)haarResponseX + lVar31 + 8)
                 ,(float *)((long)haarResponseY + lVar31 + 8));
      haarXY_unconditional
                (iimage,row,(int)auVar42._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x54),
                 (float *)((long)haarResponseY + lVar31 + -0x54));
      haarXY_unconditional
                (iimage,row_00,(int)auVar42._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0xc),
                 (float *)((long)haarResponseY + lVar31 + 0xc));
      haarXY_unconditional
                (iimage,row,(int)auVar43._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x50),
                 (float *)((long)haarResponseY + lVar31 + -0x50));
      haarXY_unconditional
                (iimage,row_00,(int)auVar43._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x10),
                 (float *)((long)haarResponseY + lVar31 + 0x10));
      haarXY_unconditional
                (iimage,row,(int)auVar44._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x4c),
                 (float *)((long)haarResponseY + lVar31 + -0x4c));
      haarXY_unconditional
                (iimage,row_00,(int)auVar44._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x14),
                 (float *)((long)haarResponseY + lVar31 + 0x14));
      haarXY_unconditional
                (iimage,row,(int)auVar45._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x48),
                 (float *)((long)haarResponseY + lVar31 + -0x48));
      haarXY_unconditional
                (iimage,row_00,(int)auVar45._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x18),
                 (float *)((long)haarResponseY + lVar31 + 0x18));
      haarXY_unconditional
                (iimage,row,(int)auVar46._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x44),
                 (float *)((long)haarResponseY + lVar31 + -0x44));
      haarXY_unconditional
                (iimage,row_00,(int)auVar46._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x1c),
                 (float *)((long)haarResponseY + lVar31 + 0x1c));
      haarXY_unconditional
                (iimage,row,(int)auVar47._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x40),
                 (float *)((long)haarResponseY + lVar31 + -0x40));
      haarXY_unconditional
                (iimage,row_00,(int)auVar47._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x20),
                 (float *)((long)haarResponseY + lVar31 + 0x20));
      haarXY_unconditional
                (iimage,row,(int)auVar48._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x3c),
                 (float *)((long)haarResponseY + lVar31 + -0x3c));
      haarXY_unconditional
                (iimage,row_00,(int)auVar48._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x24),
                 (float *)((long)haarResponseY + lVar31 + 0x24));
      haarXY_unconditional
                (iimage,row,(int)auVar49._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x38),
                 (float *)((long)haarResponseY + lVar31 + -0x38));
      haarXY_unconditional
                (iimage,row_00,(int)auVar49._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x28),
                 (float *)((long)haarResponseY + lVar31 + 0x28));
      haarXY_unconditional
                (iimage,row,(int)auVar50._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x34),
                 (float *)((long)haarResponseY + lVar31 + -0x34));
      haarXY_unconditional
                (iimage,row_00,(int)auVar50._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x2c),
                 (float *)((long)haarResponseY + lVar31 + 0x2c));
      haarXY_unconditional
                (iimage,row,(int)auVar51._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x30),
                 (float *)((long)haarResponseY + lVar31 + -0x30));
      haarXY_unconditional
                (iimage,row_00,(int)auVar51._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x30),
                 (float *)((long)haarResponseY + lVar31 + 0x30));
      haarXY_unconditional
                (iimage,row,(int)auVar39._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x2c),
                 (float *)((long)haarResponseY + lVar31 + -0x2c));
      haarXY_unconditional
                (iimage,row_00,(int)auVar39._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x34),
                 (float *)((long)haarResponseY + lVar31 + 0x34));
      haarXY_unconditional
                (iimage,row,(int)auVar40._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x28),
                 (float *)((long)haarResponseY + lVar31 + -0x28));
      haarXY_unconditional
                (iimage,row_00,(int)auVar40._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x38),
                 (float *)((long)haarResponseY + lVar31 + 0x38));
      haarXY_unconditional
                (iimage,row,(int)auVar52._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x24),
                 (float *)((long)haarResponseY + lVar31 + -0x24));
      haarXY_unconditional
                (iimage,row_00,(int)auVar52._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x3c),
                 (float *)((long)haarResponseY + lVar31 + 0x3c));
      haarXY_unconditional
                (iimage,row,(int)auVar53._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x20),
                 (float *)((long)haarResponseY + lVar31 + -0x20));
      haarXY_unconditional
                (iimage,row_00,(int)auVar53._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x40),
                 (float *)((long)haarResponseY + lVar31 + 0x40));
      haarXY_unconditional
                (iimage,row,(int)auVar54._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x1c),
                 (float *)((long)haarResponseY + lVar31 + -0x1c));
      haarXY_unconditional
                (iimage,row_00,(int)auVar54._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x44),
                 (float *)((long)haarResponseY + lVar31 + 0x44));
      haarXY_unconditional
                (iimage,row,(int)auVar55._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x18),
                 (float *)((long)haarResponseY + lVar31 + -0x18));
      haarXY_unconditional
                (iimage,row_00,(int)auVar55._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x48),
                 (float *)((long)haarResponseY + lVar31 + 0x48));
      haarXY_unconditional
                (iimage,row,(int)auVar56._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x14),
                 (float *)((long)haarResponseY + lVar31 + -0x14));
      haarXY_unconditional
                (iimage,row_00,(int)auVar56._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x4c),
                 (float *)((long)haarResponseY + lVar31 + 0x4c));
      haarXY_unconditional
                (iimage,row,(int)auVar57._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + -0x10),
                 (float *)((long)haarResponseY + lVar31 + -0x10));
      haarXY_unconditional
                (iimage,row_00,(int)auVar57._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x50),
                 (float *)((long)haarResponseY + lVar31 + 0x50));
      haarXY_unconditional
                (iimage,row,(int)auVar58._0_4_,iVar16,(float *)((long)haarResponseX + lVar31 + -0xc)
                 ,(float *)((long)haarResponseY + lVar31 + -0xc));
      haarXY_unconditional
                (iimage,row_00,(int)auVar59._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x58),
                 (float *)((long)haarResponseY + lVar31 + 0x58));
      haarXY_unconditional
                (iimage,row,(int)auVar60._0_4_,iVar16,(float *)((long)haarResponseX + lVar31 + -4),
                 (float *)((long)haarResponseY + lVar31 + -4));
      haarXY_unconditional
                (iimage,row_00,(int)auVar60._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x5c),
                 (float *)((long)haarResponseY + lVar31 + 0x5c));
      haarXY_unconditional
                (iimage,row_00,(int)auVar58._0_4_,iVar16,
                 (float *)((long)haarResponseX + lVar31 + 0x54),
                 (float *)((long)haarResponseY + lVar31 + 0x54));
      haarXY_unconditional
                (iimage,row,(int)auVar59._0_4_,iVar16,(float *)((long)haarResponseX + lVar31 + -8),
                 (float *)((long)haarResponseY + lVar31 + -8));
      lVar31 = lVar31 + 0x60;
    }
    lVar32 = lVar32 + 0xc0;
  }
  auVar48._8_4_ = 0x3effffff;
  auVar48._0_8_ = 0x3effffff3effffff;
  auVar48._12_4_ = 0x3effffff;
  auVar47._8_4_ = 0x80000000;
  auVar47._0_8_ = 0x8000000080000000;
  auVar47._12_4_ = 0x80000000;
  fVar73 = -0.08 / (fVar68 * fVar68);
  auVar35 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 0.5)),auVar47,0xf8);
  auVar35 = ZEXT416((uint)(fVar68 * 0.5 + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 1.5)),auVar47,0xf8);
  auVar36 = ZEXT416((uint)(fVar68 * 1.5 + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 2.5)),auVar47,0xf8);
  auVar37 = ZEXT416((uint)(fVar68 * 2.5 + auVar37._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar41 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 3.5)),auVar47,0xf8);
  auVar41 = ZEXT416((uint)(fVar68 * 3.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar38 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 4.5)),auVar47,0xf8);
  auVar38 = ZEXT416((uint)(fVar68 * 4.5 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar42 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 5.5)),auVar47,0xf8);
  auVar42 = ZEXT416((uint)(fVar68 * 5.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar67 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 6.5)),auVar47,0xf8);
  auVar67 = ZEXT416((uint)(fVar68 * 6.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar43 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 7.5)),auVar47,0xf8);
  auVar43 = ZEXT416((uint)(auVar43._0_4_ + fVar68 * 7.5));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 8.5)),auVar47,0xf8);
  auVar44 = ZEXT416((uint)(fVar68 * 8.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 9.5)),auVar47,0xf8);
  auVar45 = ZEXT416((uint)(fVar68 * 9.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 10.5)),auVar47,0xf8);
  auVar46 = ZEXT416((uint)(fVar68 * 10.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar68 * 11.5)),auVar47,0xf8);
  fVar70 = auVar37._0_4_;
  fVar4 = fVar70 + auVar36._0_4_;
  fVar3 = fVar70 + auVar35._0_4_;
  auVar37 = ZEXT416((uint)(fVar68 * 11.5 + auVar47._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  fVar68 = fVar70 - auVar35._0_4_;
  fVar5 = fVar70 - auVar36._0_4_;
  fVar6 = fVar70 - auVar41._0_4_;
  fVar7 = fVar70 - auVar38._0_4_;
  fVar8 = fVar70 - auVar42._0_4_;
  fVar70 = fVar70 - auVar67._0_4_;
  fVar72 = auVar43._0_4_;
  fVar9 = fVar72 - auVar41._0_4_;
  fVar10 = fVar72 - auVar38._0_4_;
  fVar11 = fVar72 - auVar42._0_4_;
  fVar12 = fVar72 - auVar67._0_4_;
  fVar13 = fVar72 - auVar44._0_4_;
  fVar14 = fVar72 - auVar45._0_4_;
  fVar15 = fVar72 - auVar46._0_4_;
  fVar72 = fVar72 - auVar37._0_4_;
  gauss_s1_c0[0] = expf(fVar73 * fVar4 * fVar4);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar73);
  gauss_s1_c0[2] = expf(fVar68 * fVar68 * fVar73);
  gauss_s1_c0[3] = expf(fVar5 * fVar5 * fVar73);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar6 * fVar6 * fVar73);
  gauss_s1_c0[6] = expf(fVar7 * fVar7 * fVar73);
  gauss_s1_c0[7] = expf(fVar8 * fVar8 * fVar73);
  gauss_s1_c0[8] = expf(fVar70 * fVar70 * fVar73);
  gauss_s1_c1[0] = expf(fVar9 * fVar9 * fVar73);
  gauss_s1_c1[1] = expf(fVar10 * fVar10 * fVar73);
  gauss_s1_c1[2] = expf(fVar11 * fVar11 * fVar73);
  gauss_s1_c1[3] = expf(fVar12 * fVar12 * fVar73);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar13 * fVar13 * fVar73);
  gauss_s1_c1[6] = expf(fVar14 * fVar14 * fVar73);
  gauss_s1_c1[7] = expf(fVar15 * fVar15 * fVar73);
  gauss_s1_c1[8] = expf(fVar72 * fVar72 * fVar73);
  auVar69 = ZEXT1264(ZEXT812(0));
  iVar16 = 0;
  auVar35._8_4_ = 0x7fffffff;
  auVar35._0_8_ = 0x7fffffff7fffffff;
  auVar35._12_4_ = 0x7fffffff;
  lVar32 = 0;
  uVar29 = 0xfffffffffffffff8;
  pfVar23 = haarResponseY;
  pfVar26 = haarResponseX;
  while (uVar19 = (uint)uVar29, (int)uVar19 < 8) {
    pfVar22 = gauss_s1_c0;
    lVar31 = (long)iVar16;
    lVar32 = (long)(int)lVar32;
    if (uVar19 == 7) {
      pfVar22 = gauss_s1_c1;
    }
    if (uVar19 == 0xfffffff8) {
      pfVar22 = gauss_s1_c1;
    }
    uVar33 = 0;
    iVar16 = iVar16 + 4;
    uVar21 = 0xfffffffffffffff8;
    pfVar24 = pfVar23;
    pfVar27 = pfVar26;
    while (lVar31 != iVar16) {
      iVar17 = (int)uVar21;
      pfVar28 = gauss_s1_c0;
      auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar21 = (ulong)((uint)(uVar21 >> 0x1c) & 8);
      if (iVar17 == 7) {
        pfVar28 = gauss_s1_c1;
      }
      if (iVar17 == -8) {
        pfVar28 = gauss_s1_c1;
      }
      pfVar18 = pfVar27;
      pfVar25 = pfVar24;
      for (uVar20 = uVar33; uVar20 < iVar17 * 0x18 + 0x198; uVar20 = uVar20 + 0x18) {
        lVar30 = 0;
        pfVar34 = (float *)((long)pfVar22 + (ulong)(((uint)(uVar29 >> 0x1f) & 1) << 5));
        while (lVar30 != 9) {
          fVar68 = *pfVar34;
          pfVar34 = pfVar34 + (ulong)(~uVar19 >> 0x1f) * 2 + -1;
          pfVar2 = pfVar25 + lVar30;
          pfVar1 = pfVar18 + lVar30;
          lVar30 = lVar30 + 1;
          auVar41 = ZEXT416((uint)(pfVar28[uVar21] * fVar68 * *pfVar1));
          auVar36 = vandps_avx(auVar41,auVar35);
          auVar38 = ZEXT416((uint)(pfVar28[uVar21] * fVar68 * *pfVar2));
          auVar37 = vandps_avx(auVar38,auVar35);
          auVar41 = vinsertps_avx(auVar38,auVar41,0x10);
          auVar37 = vmovlhps_avx(auVar41,auVar37);
          auVar36 = vinsertps_avx(auVar37,auVar36,0x30);
          auVar71 = ZEXT1664(CONCAT412(auVar71._12_4_ + auVar36._12_4_,
                                       CONCAT48(auVar71._8_4_ + auVar36._8_4_,
                                                CONCAT44(auVar71._4_4_ + auVar36._4_4_,
                                                         auVar71._0_4_ + auVar36._0_4_))));
        }
        uVar21 = uVar21 + (ulong)(-1 < iVar17) * 2 + -1;
        pfVar18 = pfVar18 + 0x18;
        pfVar25 = pfVar25 + 0x18;
      }
      uVar21 = (ulong)(iVar17 + 5);
      uVar33 = uVar33 + 0x78;
      fVar68 = gauss_s2_arr[lVar31];
      auVar36._4_4_ = fVar68;
      auVar36._0_4_ = fVar68;
      auVar36._8_4_ = fVar68;
      auVar36._12_4_ = fVar68;
      auVar38 = vmulps_avx512vl(auVar71._0_16_,auVar36);
      lVar31 = lVar31 + 1;
      auVar67._0_4_ = auVar38._0_4_ * auVar38._0_4_;
      auVar67._4_4_ = auVar38._4_4_ * auVar38._4_4_;
      auVar67._8_4_ = auVar38._8_4_ * auVar38._8_4_;
      auVar67._12_4_ = auVar38._12_4_ * auVar38._12_4_;
      auVar37 = vshufpd_avx(auVar38,auVar38,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar32) = auVar38;
      lVar32 = lVar32 + 4;
      pfVar27 = pfVar27 + 0x78;
      pfVar24 = pfVar24 + 0x78;
      auVar36 = vmovshdup_avx(auVar67);
      auVar41 = vfmadd231ss_fma(auVar36,auVar38,auVar38);
      auVar36 = vshufps_avx(auVar38,auVar38,0xff);
      auVar37 = vfmadd213ss_fma(auVar37,auVar37,auVar41);
      auVar36 = vfmadd213ss_fma(auVar36,auVar36,auVar37);
      auVar69 = ZEXT464((uint)(auVar69._0_4_ + auVar36._0_4_));
    }
    pfVar26 = pfVar26 + 5;
    pfVar23 = pfVar23 + 5;
    uVar29 = (ulong)(uVar19 + 5);
  }
  if (auVar69._0_4_ < 0.0) {
    fVar68 = sqrtf(auVar69._0_4_);
  }
  else {
    auVar35 = vsqrtss_avx(auVar69._0_16_,auVar69._0_16_);
    fVar68 = auVar35._0_4_;
  }
  for (lVar32 = 0; lVar32 != 0x40; lVar32 = lVar32 + 1) {
    ipoint->descriptor[lVar32] = (1.0 / fVar68) * ipoint->descriptor[lVar32];
  }
  return;
}

Assistant:

void get_msurf_descriptor_rounding_unroll_2_24_True_winner_unconditional(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    // if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
    //     || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
    //     || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
    //     || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    // { // still need this for rounding to work -.-
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) roundf(ipoint_y_sub_int_scale_add_l0_mul_scale);// + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) roundf(ipoint_y_sub_int_scale_add_l1_mul_scale);// + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=24, k_count+=24) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k12 = k + 12;
                int k13 = k + 13;
                int k14 = k + 14;
                int k15 = k + 15;
                int k16 = k + 16;
                int k17 = k + 17;
                int k18 = k + 18;
                int k19 = k + 19;
                int k20 = k + 20;
                int k21 = k + 21;
                int k22 = k + 22;
                int k23 = k + 23;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int k_count12 = k_count + 12;
                int k_count13 = k_count + 13;
                int k_count14 = k_count + 14;
                int k_count15 = k_count + 15;
                int k_count16 = k_count + 16;
                int k_count17 = k_count + 17;
                int k_count18 = k_count + 18;
                int k_count19 = k_count + 19;
                int k_count20 = k_count + 20;
                int k_count21 = k_count + 21;
                int k_count22 = k_count + 22;
                int k_count23 = k_count + 23;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                float ipoint_x_sub_int_scale_add_k12_mul_scale = ipoint_x_sub_int_scale + k12 * scale;
                float ipoint_x_sub_int_scale_add_k13_mul_scale = ipoint_x_sub_int_scale + k13 * scale;
                float ipoint_x_sub_int_scale_add_k14_mul_scale = ipoint_x_sub_int_scale + k14 * scale;
                float ipoint_x_sub_int_scale_add_k15_mul_scale = ipoint_x_sub_int_scale + k15 * scale;
                float ipoint_x_sub_int_scale_add_k16_mul_scale = ipoint_x_sub_int_scale + k16 * scale;
                float ipoint_x_sub_int_scale_add_k17_mul_scale = ipoint_x_sub_int_scale + k17 * scale;
                float ipoint_x_sub_int_scale_add_k18_mul_scale = ipoint_x_sub_int_scale + k18 * scale;
                float ipoint_x_sub_int_scale_add_k19_mul_scale = ipoint_x_sub_int_scale + k19 * scale;
                float ipoint_x_sub_int_scale_add_k20_mul_scale = ipoint_x_sub_int_scale + k20 * scale;
                float ipoint_x_sub_int_scale_add_k21_mul_scale = ipoint_x_sub_int_scale + k21 * scale;
                float ipoint_x_sub_int_scale_add_k22_mul_scale = ipoint_x_sub_int_scale + k22 * scale;
                float ipoint_x_sub_int_scale_add_k23_mul_scale = ipoint_x_sub_int_scale + k23 * scale;
                int sample_x_sub_int_scale1 = (int) roundf(ipoint_x_sub_int_scale_add_k1_mul_scale);// + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale0 = (int) roundf(ipoint_x_sub_int_scale_add_k0_mul_scale);// + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) roundf(ipoint_x_sub_int_scale_add_k2_mul_scale);// + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) roundf(ipoint_x_sub_int_scale_add_k3_mul_scale);// + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) roundf(ipoint_x_sub_int_scale_add_k4_mul_scale);// + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) roundf(ipoint_x_sub_int_scale_add_k5_mul_scale);// + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) roundf(ipoint_x_sub_int_scale_add_k6_mul_scale);// + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) roundf(ipoint_x_sub_int_scale_add_k7_mul_scale);// + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) roundf(ipoint_x_sub_int_scale_add_k8_mul_scale);// + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) roundf(ipoint_x_sub_int_scale_add_k9_mul_scale);// + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) roundf(ipoint_x_sub_int_scale_add_k10_mul_scale);// + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) roundf(ipoint_x_sub_int_scale_add_k11_mul_scale);// + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale12 = (int) roundf(ipoint_x_sub_int_scale_add_k12_mul_scale);// + (ipoint_x_sub_int_scale_add_k12_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale13 = (int) roundf(ipoint_x_sub_int_scale_add_k13_mul_scale);// + (ipoint_x_sub_int_scale_add_k13_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale14 = (int) roundf(ipoint_x_sub_int_scale_add_k14_mul_scale);// + (ipoint_x_sub_int_scale_add_k14_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale15 = (int) roundf(ipoint_x_sub_int_scale_add_k15_mul_scale);// + (ipoint_x_sub_int_scale_add_k15_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale16 = (int) roundf(ipoint_x_sub_int_scale_add_k16_mul_scale);// + (ipoint_x_sub_int_scale_add_k16_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale17 = (int) roundf(ipoint_x_sub_int_scale_add_k17_mul_scale);// + (ipoint_x_sub_int_scale_add_k17_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale18 = (int) roundf(ipoint_x_sub_int_scale_add_k18_mul_scale);// + (ipoint_x_sub_int_scale_add_k18_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale19 = (int) roundf(ipoint_x_sub_int_scale_add_k19_mul_scale);// + (ipoint_x_sub_int_scale_add_k19_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale20 = (int) roundf(ipoint_x_sub_int_scale_add_k20_mul_scale);// + (ipoint_x_sub_int_scale_add_k20_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale21 = (int) roundf(ipoint_x_sub_int_scale_add_k21_mul_scale);// + (ipoint_x_sub_int_scale_add_k21_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale22 = (int) roundf(ipoint_x_sub_int_scale_add_k22_mul_scale);// + (ipoint_x_sub_int_scale_add_k22_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale23 = (int) roundf(ipoint_x_sub_int_scale_add_k23_mul_scale);// + (ipoint_x_sub_int_scale_add_k23_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count0*24+k_count12], &haarResponseY[l_count0*24+k_count12]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count1*24+k_count12], &haarResponseY[l_count1*24+k_count12]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count0*24+k_count13], &haarResponseY[l_count0*24+k_count13]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count1*24+k_count13], &haarResponseY[l_count1*24+k_count13]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count0*24+k_count14], &haarResponseY[l_count0*24+k_count14]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count1*24+k_count14], &haarResponseY[l_count1*24+k_count14]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count0*24+k_count15], &haarResponseY[l_count0*24+k_count15]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count1*24+k_count15], &haarResponseY[l_count1*24+k_count15]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count0*24+k_count16], &haarResponseY[l_count0*24+k_count16]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count1*24+k_count16], &haarResponseY[l_count1*24+k_count16]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count0*24+k_count17], &haarResponseY[l_count0*24+k_count17]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count1*24+k_count17], &haarResponseY[l_count1*24+k_count17]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count0*24+k_count18], &haarResponseY[l_count0*24+k_count18]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count1*24+k_count18], &haarResponseY[l_count1*24+k_count18]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count0*24+k_count19], &haarResponseY[l_count0*24+k_count19]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count1*24+k_count19], &haarResponseY[l_count1*24+k_count19]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count0*24+k_count20], &haarResponseY[l_count0*24+k_count20]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count1*24+k_count20], &haarResponseY[l_count1*24+k_count20]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count0*24+k_count21], &haarResponseY[l_count0*24+k_count21]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count1*24+k_count22], &haarResponseY[l_count1*24+k_count22]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count0*24+k_count23], &haarResponseY[l_count0*24+k_count23]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count1*24+k_count23], &haarResponseY[l_count1*24+k_count23]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count1*24+k_count21], &haarResponseY[l_count1*24+k_count21]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count0*24+k_count22], &haarResponseY[l_count0*24+k_count22]);
            }
        }
    // } else {
    //     for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
    //         int l0 = l + 0;
    //         int l1 = l + 1;
    //         int l_count0 = l_count + 0;
    //         int l_count1 = l_count + 1;
    //         int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
    //         int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

    //         for (int k=-12, k_count=0; k<12; k+=24, k_count+=24) {
    //             int k0 = k + 0;
    //             int k1 = k + 1;
    //             int k2 = k + 2;
    //             int k3 = k + 3;
    //             int k4 = k + 4;
    //             int k5 = k + 5;
    //             int k6 = k + 6;
    //             int k7 = k + 7;
    //             int k8 = k + 8;
    //             int k9 = k + 9;
    //             int k10 = k + 10;
    //             int k11 = k + 11;
    //             int k12 = k + 12;
    //             int k13 = k + 13;
    //             int k14 = k + 14;
    //             int k15 = k + 15;
    //             int k16 = k + 16;
    //             int k17 = k + 17;
    //             int k18 = k + 18;
    //             int k19 = k + 19;
    //             int k20 = k + 20;
    //             int k21 = k + 21;
    //             int k22 = k + 22;
    //             int k23 = k + 23;
    //             int k_count0 = k_count + 0;
    //             int k_count1 = k_count + 1;
    //             int k_count2 = k_count + 2;
    //             int k_count3 = k_count + 3;
    //             int k_count4 = k_count + 4;
    //             int k_count5 = k_count + 5;
    //             int k_count6 = k_count + 6;
    //             int k_count7 = k_count + 7;
    //             int k_count8 = k_count + 8;
    //             int k_count9 = k_count + 9;
    //             int k_count10 = k_count + 10;
    //             int k_count11 = k_count + 11;
    //             int k_count12 = k_count + 12;
    //             int k_count13 = k_count + 13;
    //             int k_count14 = k_count + 14;
    //             int k_count15 = k_count + 15;
    //             int k_count16 = k_count + 16;
    //             int k_count17 = k_count + 17;
    //             int k_count18 = k_count + 18;
    //             int k_count19 = k_count + 19;
    //             int k_count20 = k_count + 20;
    //             int k_count21 = k_count + 21;
    //             int k_count22 = k_count + 22;
    //             int k_count23 = k_count + 23;
    //             int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
    //             int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
    //             int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
    //             int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
    //             int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
    //             int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
    //             int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
    //             int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
    //             int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
    //             int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
    //             int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
    //             int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);
    //             int sample_x_sub_int_scale12 = (int) (ipoint_x_sub_int_scale_add_05 + k12 * scale);
    //             int sample_x_sub_int_scale13 = (int) (ipoint_x_sub_int_scale_add_05 + k13 * scale);
    //             int sample_x_sub_int_scale14 = (int) (ipoint_x_sub_int_scale_add_05 + k14 * scale);
    //             int sample_x_sub_int_scale15 = (int) (ipoint_x_sub_int_scale_add_05 + k15 * scale);
    //             int sample_x_sub_int_scale16 = (int) (ipoint_x_sub_int_scale_add_05 + k16 * scale);
    //             int sample_x_sub_int_scale17 = (int) (ipoint_x_sub_int_scale_add_05 + k17 * scale);
    //             int sample_x_sub_int_scale18 = (int) (ipoint_x_sub_int_scale_add_05 + k18 * scale);
    //             int sample_x_sub_int_scale19 = (int) (ipoint_x_sub_int_scale_add_05 + k19 * scale);
    //             int sample_x_sub_int_scale20 = (int) (ipoint_x_sub_int_scale_add_05 + k20 * scale);
    //             int sample_x_sub_int_scale21 = (int) (ipoint_x_sub_int_scale_add_05 + k21 * scale);
    //             int sample_x_sub_int_scale22 = (int) (ipoint_x_sub_int_scale_add_05 + k22 * scale);
    //             int sample_x_sub_int_scale23 = (int) (ipoint_x_sub_int_scale_add_05 + k23 * scale);

    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count0*24+k_count12], &haarResponseY[l_count0*24+k_count12]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale12, int_scale, &haarResponseX[l_count1*24+k_count12], &haarResponseY[l_count1*24+k_count12]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count0*24+k_count13], &haarResponseY[l_count0*24+k_count13]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale13, int_scale, &haarResponseX[l_count1*24+k_count13], &haarResponseY[l_count1*24+k_count13]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count0*24+k_count14], &haarResponseY[l_count0*24+k_count14]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale14, int_scale, &haarResponseX[l_count1*24+k_count14], &haarResponseY[l_count1*24+k_count14]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count0*24+k_count15], &haarResponseY[l_count0*24+k_count15]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale15, int_scale, &haarResponseX[l_count1*24+k_count15], &haarResponseY[l_count1*24+k_count15]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count0*24+k_count16], &haarResponseY[l_count0*24+k_count16]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale16, int_scale, &haarResponseX[l_count1*24+k_count16], &haarResponseY[l_count1*24+k_count16]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count0*24+k_count17], &haarResponseY[l_count0*24+k_count17]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale17, int_scale, &haarResponseX[l_count1*24+k_count17], &haarResponseY[l_count1*24+k_count17]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count0*24+k_count18], &haarResponseY[l_count0*24+k_count18]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale18, int_scale, &haarResponseX[l_count1*24+k_count18], &haarResponseY[l_count1*24+k_count18]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count0*24+k_count19], &haarResponseY[l_count0*24+k_count19]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale19, int_scale, &haarResponseX[l_count1*24+k_count19], &haarResponseY[l_count1*24+k_count19]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count0*24+k_count20], &haarResponseY[l_count0*24+k_count20]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale20, int_scale, &haarResponseX[l_count1*24+k_count20], &haarResponseY[l_count1*24+k_count20]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count0*24+k_count21], &haarResponseY[l_count0*24+k_count21]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale21, int_scale, &haarResponseX[l_count1*24+k_count21], &haarResponseY[l_count1*24+k_count21]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count0*24+k_count22], &haarResponseY[l_count0*24+k_count22]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale22, int_scale, &haarResponseX[l_count1*24+k_count22], &haarResponseY[l_count1*24+k_count22]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count0*24+k_count23], &haarResponseY[l_count0*24+k_count23]);
    //             haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale23, int_scale, &haarResponseX[l_count1*24+k_count23], &haarResponseY[l_count1*24+k_count23]);
    //         }
    //     }
    // }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));
    
        // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}